

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.h
# Opt level: O2

bool winmd::reader::filter::match
               (string_view *type_namespace,string_view *type_name,string_view *match)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  
  if (type_namespace->_M_len < match->_M_len) {
    bVar1 = impl::starts_with(match,type_namespace);
    if ((bVar1) && (match->_M_str[type_namespace->_M_len] == '.')) {
      local_28 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                           (match,type_namespace->_M_len + 1,0xffffffffffffffff);
      bVar1 = impl::starts_with(type_name,&local_28);
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  bVar1 = impl::starts_with(type_namespace,match);
  return bVar1;
}

Assistant:

static bool match(std::string_view const& type_namespace, std::string_view const& type_name, std::string_view const& match) noexcept
        {
            if (match.size() <= type_namespace.size())
            {
                return impl::starts_with(type_namespace, match);
            }

            if (!impl::starts_with(match, type_namespace))
            {
                return false;
            }

            if (match[type_namespace.size()] != '.')
            {
                return false;
            }

            return impl::starts_with(type_name, match.substr(type_namespace.size() + 1));
        }